

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

TIFFReadDirEntryErr TIFFReadDirEntryData(TIFF *tif,uint64_t offset,tmsize_t size,void *dest)

{
  int iVar1;
  tmsize_t tVar2;
  
  if ((tif->tif_flags & 0x800) == 0) {
    iVar1 = _TIFFSeekOK(tif,offset);
    if (iVar1 == 0) {
      return TIFFReadDirEntryErrIo;
    }
    tVar2 = (*tif->tif_readproc)(tif->tif_clientdata,dest,size);
    if (tVar2 != size) {
      return TIFFReadDirEntryErrIo;
    }
  }
  else {
    if (CARRY8(size,offset)) {
      return TIFFReadDirEntryErrIo;
    }
    if ((ulong)tif->tif_size < size + offset) {
      return TIFFReadDirEntryErrIo;
    }
    _TIFFmemcpy(dest,tif->tif_base + offset,size);
  }
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr TIFFReadDirEntryData(TIFF *tif, uint64_t offset,
                                                     tmsize_t size, void *dest)
{
    assert(size > 0);
    if (!isMapped(tif))
    {
        if (!SeekOK(tif, offset))
            return (TIFFReadDirEntryErrIo);
        if (!ReadOK(tif, dest, size))
            return (TIFFReadDirEntryErrIo);
    }
    else
    {
        size_t ma, mb;
        ma = (size_t)offset;
        if ((uint64_t)ma != offset || ma > (~(size_t)0) - (size_t)size)
        {
            return TIFFReadDirEntryErrIo;
        }
        mb = ma + size;
        if (mb > (uint64_t)tif->tif_size)
            return (TIFFReadDirEntryErrIo);
        _TIFFmemcpy(dest, tif->tif_base + ma, size);
    }
    return (TIFFReadDirEntryErrOk);
}